

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_transform_base.h
# Opt level: O0

int32_t __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::GetRotationCount
          (PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *this,Point2 *pred)

{
  int iVar1;
  int iVar2;
  Scalar_conflict3 *pSVar3;
  VectorD<int,_2> *in_RSI;
  int32_t rotation_count;
  DataType sign_y;
  DataType sign_x;
  int in_stack_ffffffffffffffcc;
  undefined4 local_1c;
  
  pSVar3 = VectorD<int,_2>::operator[](in_RSI,in_stack_ffffffffffffffcc);
  iVar1 = *pSVar3;
  pSVar3 = VectorD<int,_2>::operator[](in_RSI,in_stack_ffffffffffffffcc);
  iVar2 = *pSVar3;
  if (iVar1 == 0) {
    if (iVar2 == 0) {
      local_1c = 0;
    }
    else if (iVar2 < 1) {
      local_1c = 1;
    }
    else {
      local_1c = 3;
    }
  }
  else if (iVar1 < 1) {
    if (iVar2 < 1) {
      local_1c = 0;
    }
    else {
      local_1c = 3;
    }
  }
  else if (iVar2 < 0) {
    local_1c = 1;
  }
  else {
    local_1c = 2;
  }
  return local_1c;
}

Assistant:

int32_t GetRotationCount(Point2 pred) const {
    const DataType sign_x = pred[0];
    const DataType sign_y = pred[1];

    int32_t rotation_count = 0;
    if (sign_x == 0) {
      if (sign_y == 0) {
        rotation_count = 0;
      } else if (sign_y > 0) {
        rotation_count = 3;
      } else {
        rotation_count = 1;
      }
    } else if (sign_x > 0) {
      if (sign_y >= 0) {
        rotation_count = 2;
      } else {
        rotation_count = 1;
      }
    } else {
      if (sign_y <= 0) {
        rotation_count = 0;
      } else {
        rotation_count = 3;
      }
    }
    return rotation_count;
  }